

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O2

int testValid_Classifier_PredictedFeatureName(void)

{
  int iVar1;
  Rep *pRVar2;
  bool bVar3;
  ModelDescription *pMVar4;
  FeatureDescription *pFVar5;
  FeatureType *this;
  ostream *poVar6;
  long lVar7;
  void **ppvVar8;
  allocator<char> local_1aa;
  allocator<char> local_1a9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  classLabels;
  Model spec;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_160;
  FeatureDescription feature;
  _Vector_base<long,_std::allocator<long>_> local_118;
  TensorAttributes tensorAttributesIn;
  Result res;
  string labels [4];
  
  CoreML::Specification::Model::Model(&spec);
  CoreML::Result::Result(&res);
  tensorAttributesIn.name = "InTensor";
  tensorAttributesIn.dimension = 3;
  tensorAttributesIn._12_4_ = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)labels,"1",(allocator<char> *)&feature);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(labels + 1),"2",(allocator<char> *)&classLabels);
  std::__cxx11::string::string<std::allocator<char>>((string *)(labels + 2),"3",&local_1a9);
  std::__cxx11::string::string<std::allocator<char>>((string *)(labels + 3),"4",&local_1aa);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<std::__cxx11::string*,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&classLabels,
             labels,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &stack0xffffffffffffffc8,(allocator_type *)&feature);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_160,&classLabels);
  local_118._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buildBasicNeuralNetworkClassifierModel
            (&spec,true,&tensorAttributesIn,&local_160,
             (vector<long,_std::allocator<long>_> *)&local_118,true);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_118);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_160);
  spec.specificationversion_ = 4;
  pMVar4 = CoreML::Specification::Model::mutable_description(&spec);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
            (&(pMVar4->traininginput_).super_RepeatedPtrFieldBase);
  pMVar4 = spec.description_;
  if (spec.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)&CoreML::Specification::_ModelDescription_default_instance_;
  }
  pRVar2 = (pMVar4->input_).super_RepeatedPtrFieldBase.rep_;
  ppvVar8 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar8 = (void **)0x0;
  }
  iVar1 = (pMVar4->input_).super_RepeatedPtrFieldBase.current_size_;
  for (lVar7 = 0; (long)iVar1 * 8 != lVar7; lVar7 = lVar7 + 8) {
    CoreML::Specification::FeatureDescription::FeatureDescription
              (&feature,*(FeatureDescription **)((long)ppvVar8 + lVar7));
    pMVar4 = CoreML::Specification::Model::mutable_description(&spec);
    pFVar5 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                       (&pMVar4->traininginput_);
    CoreML::Specification::FeatureDescription::CopyFrom(pFVar5,&feature);
    CoreML::Specification::FeatureDescription::~FeatureDescription(&feature);
  }
  pMVar4 = CoreML::Specification::Model::mutable_description(&spec);
  pFVar5 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar4->traininginput_);
  if (spec.description_ == (ModelDescription *)0x0) {
    spec.description_ =
         (ModelDescription *)&CoreML::Specification::_ModelDescription_default_instance_;
  }
  CoreML::Specification::FeatureDescription::set_name
            (pFVar5,((spec.description_)->predictedfeaturename_).ptr_);
  this = CoreML::Specification::FeatureDescription::mutable_type(pFVar5);
  CoreML::Specification::FeatureType::mutable_stringtype(this);
  CoreML::Model::validate((Result *)&feature,&spec);
  CoreML::Result::operator=(&res,(Result *)&feature);
  std::__cxx11::string::~string((string *)&feature._internal_metadata_);
  bVar3 = CoreML::Result::good(&res);
  if (!bVar3) {
    poVar6 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0x8d6);
    poVar6 = std::operator<<(poVar6,": error: ");
    poVar6 = std::operator<<(poVar6,"(res).good()");
    poVar6 = std::operator<<(poVar6," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&classLabels);
  lVar7 = 0x60;
  do {
    std::__cxx11::string::~string((string *)((long)&labels[0]._M_dataplus._M_p + lVar7));
    lVar7 = lVar7 + -0x20;
  } while (lVar7 != -0x20);
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&spec);
  return (uint)!bVar3;
}

Assistant:

int testValid_Classifier_PredictedFeatureName() {
    Specification::Model spec;
    Result res;
    TensorAttributes tensorAttributesIn = { "InTensor", 3 };

    std::string labels[] = { "1", "2", "3", "4" };
    std::vector<std::string> classLabels(labels, labels + sizeof(labels) / sizeof(std::string));

    (void)buildBasicNeuralNetworkClassifierModel(spec, true, &tensorAttributesIn, classLabels, std::vector<int64_t>(), true);
    spec.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);

    // Clearing and then specifically adding only the predicted feature name as a training input (for the classifier)
    spec.mutable_description()->clear_traininginput();

    // Re-adding model inputs and the predicted feature name to classifier's training inputs
    for (auto feature : spec.description().input()) {
        auto trainingInput = spec.mutable_description()->mutable_traininginput()->Add();
        trainingInput->CopyFrom(feature);
    }

    auto trainingInput = spec.mutable_description()->mutable_traininginput()->Add();
    trainingInput->set_name(spec.description().predictedfeaturename());
    trainingInput->mutable_type()->mutable_stringtype();

    res = Model::validate(spec);
    ML_ASSERT_GOOD(res);

    return 0;
}